

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_elements_transaction.cpp
# Opt level: O1

ByteData256 * __thiscall
cfd::ConfidentialTransactionContext::CreateSignatureHashByTaproot
          (ByteData256 *__return_storage_ptr__,ConfidentialTransactionContext *this,
          OutPoint *outpoint,SigHashType *sighash_type,ByteData256 *tap_leaf_hash,
          uint32_t *code_separator_position,ByteData *annex)

{
  pointer puVar1;
  bool bVar2;
  uint32_t uVar3;
  CfdException *pCVar4;
  pointer pCVar5;
  TapScriptData *script_data_00;
  ulong uVar6;
  long lVar7;
  TapScriptData script_data;
  ConfidentialAssetId asset;
  vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_> utxos;
  ByteData annex_data;
  OutPoint target_outpoint;
  SigHashType local_6d4;
  BlockHash genesis_blockhash;
  UtxoData utxo;
  AbstractTxIn *this_00;
  
  UtxoData::UtxoData(&utxo);
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.
  super__Vector_base<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pCVar5 = (this->super_ConfidentialTransaction).vin_.
           super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->super_ConfidentialTransaction).vin_.
      super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>.
      _M_impl.super__Vector_impl_data._M_finish != pCVar5) {
    lVar7 = 0;
    uVar6 = 0;
    do {
      this_00 = (AbstractTxIn *)((long)&(pCVar5->super_AbstractTxIn)._vptr_AbstractTxIn + lVar7);
      core::AbstractTxIn::GetTxid((Txid *)&genesis_blockhash,this_00);
      uVar3 = core::AbstractTxIn::GetVout(this_00);
      core::OutPoint::OutPoint(&target_outpoint,(Txid *)&genesis_blockhash,uVar3);
      genesis_blockhash._vptr_BlockHash = (_func_int **)&PTR__Txid_0087c9b8;
      if (genesis_blockhash.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(genesis_blockhash.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)genesis_blockhash.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)genesis_blockhash.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      bVar2 = IsFindUtxoMap(this,&target_outpoint,&utxo);
      if (!bVar2) {
        pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
        genesis_blockhash._vptr_BlockHash =
             (_func_int **)
             &genesis_blockhash.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&genesis_blockhash,
                   "Utxo is not found. CreateSignatureHashByTaproot fail.","");
        core::CfdException::CfdException(pCVar4,kCfdIllegalStateError,(string *)&genesis_blockhash);
        __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
      }
      core::Script::Script((Script *)&annex_data,&utxo.locking_script);
      core::Address::GetAddress_abi_cxx11_((string *)&genesis_blockhash,&utxo.address);
      puVar1 = genesis_blockhash.data_.data_.
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (genesis_blockhash._vptr_BlockHash !=
          (_func_int **)
          &genesis_blockhash.data_.data_.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
        operator_delete(genesis_blockhash._vptr_BlockHash,
                        (ulong)(genesis_blockhash.data_.data_.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_finish + 1));
      }
      if (puVar1 == (pointer)0x0) {
        if (utxo.descriptor._M_string_length != 0) {
          core::Descriptor::ParseElements((Descriptor *)&genesis_blockhash,&utxo.descriptor);
          core::Descriptor::GetLockingScript
                    ((Script *)&script_data,(Descriptor *)&genesis_blockhash);
          core::Script::operator=((Script *)&annex_data,(Script *)&script_data);
          core::Script::~Script((Script *)&script_data);
          core::DescriptorNode::~DescriptorNode((DescriptorNode *)&genesis_blockhash);
        }
      }
      else {
        core::Address::GetLockingScript((Script *)&genesis_blockhash,&utxo.address);
        core::Script::operator=((Script *)&annex_data,(Script *)&genesis_blockhash);
        core::Script::~Script((Script *)&genesis_blockhash);
      }
      core::ConfidentialValue::ConfidentialValue((ConfidentialValue *)&script_data,&utxo.amount);
      core::ConfidentialAssetId::ConfidentialAssetId(&asset,&utxo.asset);
      bVar2 = core::ConfidentialValue::HasBlinding(&utxo.value_commitment);
      if (bVar2) {
        core::ConfidentialValue::operator=((ConfidentialValue *)&script_data,&utxo.value_commitment)
        ;
        bVar2 = core::ConfidentialAssetId::HasBlinding(&asset);
        if (!bVar2) {
          bVar2 = core::ConfidentialAssetId::HasBlinding(&utxo.asset_commitment);
          if (bVar2) {
            core::ConfidentialAssetId::operator=(&asset,&utxo.asset_commitment);
          }
          else {
            bVar2 = core::BlindFactor::IsEmpty(&utxo.asset_blind_factor);
            if ((bVar2) || (bVar2 = core::BlindFactor::IsEmpty(&utxo.amount_blind_factor), bVar2)) {
              pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
              genesis_blockhash._vptr_BlockHash =
                   (_func_int **)
                   &genesis_blockhash.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_finish;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&genesis_blockhash,
                         "Utxo asset and blindFactor is unmatch. CreateSignatureHashByTaproot fail."
                         ,"");
              core::CfdException::CfdException
                        (pCVar4,kCfdIllegalStateError,(string *)&genesis_blockhash);
              __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
            }
            core::ConfidentialAssetId::GetCommitment
                      ((ConfidentialAssetId *)&genesis_blockhash,&asset,&utxo.asset_blind_factor);
            core::ConfidentialAssetId::operator=(&asset,(ConfidentialAssetId *)&genesis_blockhash);
            genesis_blockhash._vptr_BlockHash = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
            if (genesis_blockhash.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(genesis_blockhash.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start,
                              (long)genesis_blockhash.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)genesis_blockhash.data_.data_.
                                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
            }
          }
        }
      }
      else {
        bVar2 = core::ConfidentialAssetId::HasBlinding(&asset);
        if (bVar2) {
          pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
          genesis_blockhash._vptr_BlockHash =
               (_func_int **)
               &genesis_blockhash.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&genesis_blockhash,
                     "Utxo asset is unmatch. CreateSignatureHashByTaproot fail.","");
          core::CfdException::CfdException
                    (pCVar4,kCfdIllegalStateError,(string *)&genesis_blockhash);
          __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
        }
      }
      core::ConfidentialTxOut::ConfidentialTxOut
                ((ConfidentialTxOut *)&genesis_blockhash,(Script *)&annex_data,&asset,
                 (ConfidentialValue *)&script_data);
      std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::
      emplace_back<cfd::core::ConfidentialTxOut>(&utxos,(ConfidentialTxOut *)&genesis_blockhash);
      core::ConfidentialTxOut::~ConfidentialTxOut((ConfidentialTxOut *)&genesis_blockhash);
      asset._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_0087ccc8;
      if (asset.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(asset.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)asset.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      script_data.tap_leaf_hash.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = "da\x1e";
      if (script_data.tap_leaf_hash.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish != (pointer)0x0) {
        operator_delete(script_data.tap_leaf_hash.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish,
                        CONCAT44(script_data._28_4_,script_data.code_separator_position) -
                        (long)script_data.tap_leaf_hash.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_finish);
      }
      core::Script::~Script((Script *)&annex_data);
      target_outpoint.txid_._vptr_Txid = (_func_int **)&PTR__Txid_0087c9b8;
      if (target_outpoint.txid_.data_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(target_outpoint.txid_.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)target_outpoint.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)target_outpoint.txid_.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      uVar6 = uVar6 + 1;
      pCVar5 = (this->super_ConfidentialTransaction).vin_.
               super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar7 = lVar7 + 0x160;
    } while (uVar6 < (ulong)(((long)(this->super_ConfidentialTransaction).vin_.
                                    super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar5 >> 5)
                            * 0x2e8ba2e8ba2e8ba3));
  }
  GetGenesisBlockHash(&genesis_blockhash,this);
  uVar3 = (*(this->super_ConfidentialTransaction).super_AbstractTransaction.
            _vptr_AbstractTransaction[0xf])(this,outpoint);
  core::ByteData::ByteData(&annex_data);
  if (annex != (ByteData *)0x0) {
    core::ByteData::operator=(&annex_data,annex);
  }
  script_data_00 = &script_data;
  core::ByteData256::ByteData256(&script_data_00->tap_leaf_hash);
  script_data.code_separator_position = 0xffffffff;
  if ((tap_leaf_hash != (ByteData256 *)0x0) &&
     (core::ByteData256::operator=(&script_data.tap_leaf_hash,tap_leaf_hash),
     code_separator_position != (uint32_t *)0x0)) {
    script_data.code_separator_position = *code_separator_position;
  }
  core::SigHashType::SigHashType(&local_6d4,sighash_type);
  if (tap_leaf_hash == (ByteData256 *)0x0) {
    script_data_00 = (TapScriptData *)0x0;
  }
  core::ConfidentialTransaction::GetElementsSchnorrSignatureHash
            (__return_storage_ptr__,&this->super_ConfidentialTransaction,uVar3,&local_6d4,
             &genesis_blockhash,&utxos,script_data_00,&annex_data);
  if (script_data.tap_leaf_hash.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(script_data.tap_leaf_hash.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)script_data.tap_leaf_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)script_data.tap_leaf_hash.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (annex_data.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(annex_data.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)annex_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)annex_data.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  genesis_blockhash._vptr_BlockHash = (_func_int **)&PTR__BlockHash_0087ccf8;
  if (genesis_blockhash.data_.data_.
      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(genesis_blockhash.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)genesis_blockhash.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)genesis_blockhash.data_.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<cfd::core::ConfidentialTxOut,_std::allocator<cfd::core::ConfidentialTxOut>_>::~vector
            (&utxos);
  UtxoData::~UtxoData(&utxo);
  return __return_storage_ptr__;
}

Assistant:

ByteData256 ConfidentialTransactionContext::CreateSignatureHashByTaproot(
    const OutPoint& outpoint, const SigHashType& sighash_type,
    const ByteData256* tap_leaf_hash, const uint32_t* code_separator_position,
    const ByteData* annex) const {
  UtxoData utxo;
  std::vector<ConfidentialTxOut> utxos;
  for (size_t index = 0; index < vin_.size(); ++index) {
    const auto& txin_ref = vin_[index];
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    if (!IsFindUtxoMap(target_outpoint, &utxo)) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo is not found. CreateSignatureHashByTaproot fail.");
    }
    Script locking_script = GetLockingScriptFromUtxoData(utxo);
    ConfidentialValue value(utxo.amount);
    ConfidentialAssetId asset = utxo.asset;
    if (utxo.value_commitment.HasBlinding()) {
      value = utxo.value_commitment;
      if (asset.HasBlinding()) {
        // fall-through
      } else if (utxo.asset_commitment.HasBlinding()) {
        asset = utxo.asset_commitment;
      } else if (
          utxo.asset_blind_factor.IsEmpty() ||
          utxo.amount_blind_factor.IsEmpty()) {
        throw CfdException(
            CfdError::kCfdIllegalStateError,
            "Utxo asset and blindFactor is unmatch. "
            "CreateSignatureHashByTaproot fail.");  // NOLINT
      } else {
        asset =
            ConfidentialAssetId::GetCommitment(asset, utxo.asset_blind_factor);
      }
    } else if (asset.HasBlinding()) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Utxo asset is unmatch. CreateSignatureHashByTaproot fail.");
    }
    utxos.emplace_back(ConfidentialTxOut(locking_script, asset, value));
  }
  BlockHash genesis_blockhash = GetGenesisBlockHash();

  uint32_t txin_index = GetTxInIndex(outpoint);
  ByteData annex_data;
  if (annex != nullptr) annex_data = *annex;
  TapScriptData script_data;
  if (tap_leaf_hash != nullptr) {
    script_data.tap_leaf_hash = *tap_leaf_hash;
    if (code_separator_position != nullptr) {
      script_data.code_separator_position = *code_separator_position;
    }
  }

  return GetElementsSchnorrSignatureHash(
      txin_index, sighash_type, genesis_blockhash, utxos,
      (tap_leaf_hash != nullptr) ? &script_data : nullptr, annex_data);
}